

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O2

sc_signed * sc_dt::operator/(sc_signed *__return_storage_ptr__,sc_signed *u,sc_signed *v)

{
  int s;
  undefined8 in_RAX;
  sc_length_param local_14;
  
  local_14.m_len = (int)((ulong)in_RAX >> 0x20);
  s = v->sgn;
  if (u->sgn == 0 || s == 0) {
    div_by_zero<int>(s);
    sc_length_param::sc_length_param(&local_14);
    sc_signed::sc_signed(__return_storage_ptr__,local_14.m_len);
  }
  else {
    div_signed_friend(__return_storage_ptr__,(uint)(u->sgn == s) * 2 + -1,u->nbits,u->ndigits,
                      u->digit,v->nbits,v->ndigits,v->digit);
  }
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator/(const sc_signed& u, const sc_signed& v)
{

  small_type s = mul_signs(u.sgn, v.sgn);

  if (s == SC_ZERO) {
    div_by_zero(v.sgn); // case 1
    return sc_signed();  // case 2
  }

  // other cases
  return div_signed_friend(s, u.nbits, u.ndigits, u.digit,
                           v.nbits, v.ndigits, v.digit);

}